

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interface.cpp
# Opt level: O2

void print_command(string *str)

{
  bool bVar1;
  char *pcVar2;
  char *pcVar3;
  
  bVar1 = std::operator!=(str,anon_var_dwarf_5588e + 0xb79);
  if (bVar1) {
    std::operator<<((ostream *)&std::cout,"  | ");
    pcVar2 = (str->_M_dataplus)._M_p;
    for (pcVar3 = pcVar2; pcVar3 != pcVar2 + str->_M_string_length; pcVar3 = pcVar3 + 1) {
      if (*pcVar3 == '\n') {
        if (pcVar3 + 1 != pcVar2 + str->_M_string_length) {
          std::operator<<((ostream *)&std::cout,"\n  | ");
        }
      }
      else {
        std::operator<<((ostream *)&std::cout,*pcVar3);
      }
      pcVar2 = (str->_M_dataplus)._M_p;
    }
    std::operator<<((ostream *)&std::cout,'\n');
    return;
  }
  return;
}

Assistant:

void print_command(string str) {
    // if the string is not empty
    if (str != "") {
        cout << "  | ";
        for(auto it = str.begin(); it != str.end(); ++it) {
            if(*it == '\n' ) {
                // and the '\n' is not at the end
                if( it + 1 != str.end() ) {
                    cout << "\n  | ";
                }
            } else {
                cout << *it;
            }
        }
        cout << '\n';
    }
}